

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2TextureHeader(LWOImporter *this,uint size,Texture *tex)

{
  uint *puVar1;
  uint8_t *puVar2;
  ushort uVar3;
  uint8_t *puVar4;
  uint uVar5;
  long lVar6;
  Logger *pLVar7;
  uint *puVar8;
  uint *puVar9;
  runtime_error *this_00;
  uint uVar10;
  long *local_50 [2];
  long local_40 [2];
  
  puVar4 = this->mFileBuffer;
  if (*puVar4 != '\0') {
    lVar6 = 1;
    do {
      if (size < (uint)lVar6) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"LWO: Invalid file, string is is too long");
        break;
      }
      this->mFileBuffer = puVar4 + lVar6;
      puVar2 = puVar4 + lVar6;
      lVar6 = lVar6 + 1;
    } while (*puVar2 != '\0');
  }
  puVar2 = this->mFileBuffer;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,puVar4);
  std::__cxx11::string::operator=((string *)&tex->ordinal,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar2 - (int)puVar4 & 1));
  if ((tex->ordinal)._M_string_length == 0) {
    pLVar7 = DefaultLogger::get();
    Logger::error(pLVar7,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::_M_replace
              ((ulong)&tex->ordinal,0,(char *)(tex->ordinal)._M_string_length,0x6e2d68);
  }
  puVar8 = (uint *)this->mFileBuffer;
  while( true ) {
    puVar1 = (uint *)((long)puVar8 + 6);
    if (puVar4 + size <= puVar1) {
      return;
    }
    uVar10 = *puVar8;
    this->mFileBuffer = (uint8_t *)(puVar8 + 1);
    uVar5 = puVar8[1];
    this->mFileBuffer = (uint8_t *)puVar1;
    puVar9 = (uint *)((ulong)(ushort)((ushort)uVar5 << 8 | (ushort)uVar5 >> 8) + (long)puVar1);
    if (puVar4 + size < puVar9) break;
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    if (uVar10 == 0x4f504143) {
      uVar3 = *(ushort *)puVar1;
      this->mFileBuffer = (uint8_t *)(puVar8 + 2);
      tex->blendType = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
      uVar10 = *(uint *)this->mFileBuffer;
      this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
      tex->mStrength =
           (float)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                  uVar10 << 0x18);
    }
    else if (uVar10 == 0x454e4142) {
      uVar3 = *(ushort *)puVar1;
      this->mFileBuffer = (uint8_t *)(puVar8 + 2);
      tex->enabled = uVar3 != 0;
    }
    else if (uVar10 == 0x4348414e) {
      uVar10 = *puVar1;
      this->mFileBuffer = (uint8_t *)((long)puVar8 + 10);
      tex->type = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                  uVar10 << 0x18;
    }
    this->mFileBuffer = (uint8_t *)puVar9;
    puVar8 = puVar9;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"LWO2: Invalid texture header chunk length","");
  std::runtime_error::runtime_error(this_00,(string *)local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2TextureHeader(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    // get the ordinal string
    GetS0( tex.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!tex.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        tex.ordinal = "\x00";
    }
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid texture header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_CHAN:
            tex.type = GetU4();
            break;
        case AI_LWO_ENAB:
            tex.enabled = GetU2() ? true : false;
            break;
        case AI_LWO_OPAC:
            tex.blendType = (Texture::BlendType)GetU2();
            tex.mStrength = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}